

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void deqp::gles2::Functional::checkColorFormatSupport(Context *context,deUint32 sizedFormat)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  istream *piVar3;
  NotSupportedError *this;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  istringstream extensions;
  
  if (((sizedFormat - 0x881a < 2) || (sizedFormat == 0x822f)) || (sizedFormat == 0x822d)) {
    iVar2 = (*context->_vptr_Context[0x7c])(context,0x1f03);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,(char *)CONCAT44(extraout_var,iVar2),&local_1c1);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&extensions,(string *)&local_1c0,_S_in);
    std::__cxx11::string::~string((string *)&local_1c0);
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_local_buf[0] = '\0';
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&extensions,(string *)&local_1c0,' ');
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::istringstream::~istringstream((istringstream *)&extensions);
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extensions,"GL_EXT_color_buffer_half_float is not supported",
                   (allocator<char> *)&local_1c0);
        tcu::NotSupportedError::NotSupportedError(this,(string *)&extensions);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      bVar1 = std::operator==(&local_1c0,"GL_EXT_color_buffer_half_float");
    } while (!bVar1);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::istringstream::~istringstream((istringstream *)&extensions);
  }
  return;
}

Assistant:

static void checkColorFormatSupport (sglr::Context& context, deUint32 sizedFormat)
{
	switch (sizedFormat)
	{
		case GL_RGBA16F:
		case GL_RGB16F:
		case GL_RG16F:
		case GL_R16F:
			if (!isExtensionSupported(context, "GL_EXT_color_buffer_half_float"))
				throw tcu::NotSupportedError("GL_EXT_color_buffer_half_float is not supported");

		default:
			break;
	}
}